

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

bool __thiscall
Lib::
FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
::hasNext(FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
          *this)

{
  bool bVar1;
  long in_RDI;
  Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  *in_stack_ffffffffffffff98;
  Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  *in_stack_ffffffffffffffa0;
  MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  *in_stack_ffffffffffffffc8;
  
  while( true ) {
    bVar1 = OptionBase<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
            ::isSome((OptionBase<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                      *)(in_RDI + 0x10));
    if (!bVar1) {
      return false;
    }
    Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
    ::operator->((Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                  *)0x769298);
    bVar1 = VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
            ::hasNext((VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                       *)0x7692a0);
    if (bVar1) break;
    bVar1 = MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
            ::hasNext((MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                       *)0x7692ba);
    if (bVar1) {
      in_stack_ffffffffffffffa0 =
           (Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
            *)&stack0xffffffffffffffc8;
      MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ::next(in_stack_ffffffffffffffc8);
      move_if_value<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>,_true>
                ((VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                  *)in_stack_ffffffffffffff98);
      Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ::OptionBase(in_stack_ffffffffffffffa0,
                   (VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                    *)in_stack_ffffffffffffff98);
    }
    else {
      Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ::Option((Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                *)0x76931e);
    }
    Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
    ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
    ::~Option((Option<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
               *)0x769341);
    if (bVar1) {
      VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
      ::~VirtualIterator((VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                          *)in_stack_ffffffffffffffa0);
      VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
      ::~VirtualIterator((VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                          *)in_stack_ffffffffffffffa0);
    }
  }
  return true;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }